

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_newmember(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)

{
  bool bVar1;
  SQObjectPtr *n;
  SQVM *this;
  SQVM *in_RDI;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  SQObjectPtr *in_stack_00000008;
  SQObjectPtr *in_stack_00000010;
  SQObjectPtr *in_stack_00000018;
  SQObjectPtr *in_stack_00000020;
  SQObjectPtr *key;
  SQObjectPtr *self;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQRESULT local_8;
  
  n = stack_get(in_stack_ffffffffffffffb0,
                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((n->super_SQObject)._type == OT_CLASS) {
    this = (SQVM *)SQVM::GetUp(in_stack_ffffffffffffffb0,
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (*(SQObjectType *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
        OT_NULL) {
      local_8 = sq_throwerror(in_stack_ffffffffffffffb0,
                              (SQChar *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      SQVM::GetUp(in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      SQVM::GetUp(in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bVar1 = SQVM::NewSlotA((SQVM *)key,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                             in_stack_00000008,(bool)unaff_retaddr_00,(bool)unaff_retaddr);
      if (bVar1) {
        SQVM::Pop(this,(SQInteger)n);
        local_8 = 0;
      }
      else {
        SQVM::Pop(this,(SQInteger)n);
        local_8 = -1;
      }
    }
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffb0,
                            (SQChar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
    ;
  }
  return local_8;
}

Assistant:

SQRESULT sq_newmember(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)
{
    SQObjectPtr &self = stack_get(v, idx);
    if(sq_type(self) != OT_CLASS) return sq_throwerror(v, _SC("new member only works with classes"));
    SQObjectPtr &key = v->GetUp(-3);
    if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null key"));
    if(!v->NewSlotA(self,key,v->GetUp(-2),v->GetUp(-1),bstatic?true:false,false)) {
        v->Pop(3);
        return SQ_ERROR;
    }
    v->Pop(3);
    return SQ_OK;
}